

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::BuildTLAS(DeviceContextVkImpl *this,BuildTLASAttribs *Attribs)

{
  Uint32 *pUVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  TLASBuildInstanceData *pTVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  void *pvVar11;
  bool bVar12;
  VkGeometryInstanceFlagsKHR VVar13;
  VkBuildAccelerationStructureFlagsKHR VVar14;
  TopLevelASVkImpl *TLAS;
  BufferVkImpl *Buffer;
  BufferVkImpl *pBuffVk;
  BottomLevelASVkImpl *BLAS;
  VkDeviceAddress VVar15;
  ulong uVar16;
  VkDeviceSize SizeInBytes;
  long lVar17;
  long lVar18;
  ulong uVar19;
  TLASInstanceDesc TVar20;
  VkAccelerationStructureBuildRangeInfoKHR *vkRangePtr;
  VkAccelerationStructureBuildGeometryInfoKHR vkASBuildInfo;
  string msg_1;
  VulkanUploadAllocation TmpSpace;
  VkAccelerationStructureBuildRangeInfoKHR local_40;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::BuildTLAS
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  TLAS = ClassPtrCast<Diligent::TopLevelASVkImpl,Diligent::ITopLevelAS>(Attribs->pTLAS);
  Buffer = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(Attribs->pScratchBuffer);
  pBuffVk = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(Attribs->pInstanceBuffer);
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyTLASState
            (this,TLAS,Attribs->TLASTransitionMode,RESOURCE_STATE_BUILD_AS_WRITE,
             "Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)");
  TransitionOrVerifyBufferState
            (this,Buffer,Attribs->ScratchBufferTransitionMode,RESOURCE_STATE_BUILD_AS_WRITE,
             VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR,
             "Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)");
  if (Attribs->Update == true) {
    bVar12 = TopLevelASBase<Diligent::EngineVkImplTraits>::UpdateInstances
                       (&TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>,
                        Attribs->pInstances,Attribs->InstanceCount,
                        Attribs->BaseContributionToHitGroupIndex,Attribs->HitGroupStride,
                        Attribs->BindingMode);
  }
  else {
    bVar12 = TopLevelASBase<Diligent::EngineVkImplTraits>::SetInstanceData
                       (&TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>,
                        Attribs->pInstances,Attribs->InstanceCount,
                        Attribs->BaseContributionToHitGroupIndex,Attribs->HitGroupStride,
                        Attribs->BindingMode);
  }
  if (bVar12 != false) {
    SizeInBytes = (ulong)Attribs->InstanceCount << 6;
    VulkanUploadHeap::Allocate(&TmpSpace,&this->m_UploadHeap,SizeInBytes,0x10);
    lVar18 = 0x45;
    for (uVar16 = 0; uVar16 < Attribs->InstanceCount; uVar16 = uVar16 + 1) {
      pTVar4 = Attribs->pInstances;
      TVar20 = TopLevelASBase<Diligent::EngineVkImplTraits>::GetInstanceDesc
                         (&TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>,
                          *(char **)((long)((pTVar4->Transform).data + -6) + 0xb + lVar18));
      pvVar11 = TmpSpace.CPUAddress;
      if (Attribs->InstanceCount <= TVar20.InstanceIndex) {
        FormatString<char[32]>
                  ((string *)&vkASBuildInfo,(char (*) [32])"Failed to find instance by name");
        DebugAssertionFailed
                  ((Char *)vkASBuildInfo._0_8_,"BuildTLAS",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xe88);
        std::__cxx11::string::~string((string *)&vkASBuildInfo);
        return;
      }
      lVar17 = (TVar20._0_8_ >> 0x20) * 0x40;
      BLAS = ClassPtrCast<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>
                       (*(IBottomLevelAS **)((long)((pTVar4->Transform).data + -5) + 3 + lVar18));
      puVar3 = (undefined8 *)((long)((pTVar4->Transform).data + -5) + 0xb + lVar18);
      uVar6 = puVar3[1];
      puVar2 = (undefined8 *)((long)((pTVar4->Transform).data + -4) + 0xb + lVar18);
      uVar7 = *puVar2;
      uVar8 = puVar2[1];
      puVar2 = (undefined8 *)((long)((pTVar4->Transform).data + -3) + 0xb + lVar18);
      uVar9 = *puVar2;
      uVar10 = puVar2[1];
      *(undefined8 *)((long)pvVar11 + lVar17) = *puVar3;
      ((undefined8 *)((long)pvVar11 + lVar17))[1] = uVar6;
      puVar3 = (undefined8 *)((long)pvVar11 + lVar17 + 0x10);
      *puVar3 = uVar7;
      puVar3[1] = uVar8;
      puVar3 = (undefined8 *)((long)pvVar11 + lVar17 + 0x20);
      *puVar3 = uVar9;
      puVar3[1] = uVar10;
      uVar5 = *(ulong *)((long)pvVar11 + lVar17 + 0x30);
      uVar19 = (TVar20._0_8_ << 0x20 |
               (ulong)*(uint *)((long)((pTVar4->Transform).data + -2) + 0xb + lVar18)) &
               0xffffff00ffffff;
      *(ulong *)((long)pvVar11 + lVar17 + 0x30) = uVar19 | uVar5 & 0xff000000ff000000;
      *(ulong *)((long)pvVar11 + lVar17 + 0x30) =
           uVar19 | uVar5 & 0xff00000000000000 |
           (ulong)*(byte *)((long)((pTVar4->Transform).data + -1) + lVar18) << 0x18;
      VVar13 = InstanceFlagsToVkGeometryInstanceFlags
                         (*(RAYTRACING_INSTANCE_FLAGS *)
                           ((long)((pTVar4->Transform).data + -2) + 0xf + lVar18));
      *(char *)((long)pvVar11 + lVar17 + 0x37) = (char)VVar13;
      *(VkDeviceAddress *)((long)pvVar11 + lVar17 + 0x38) = BLAS->m_DeviceAddress;
      TransitionOrVerifyBLASState
                (this,BLAS,Attribs->BLASTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
                 "Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)");
      lVar18 = lVar18 + 0x50;
    }
    UpdateBufferRegion(this,pBuffVk,Attribs->InstanceBufferOffset,SizeInBytes,TmpSpace.vkBuffer,
                       TmpSpace.AlignedOffset,Attribs->InstanceBufferTransitionMode);
    TransitionOrVerifyBufferState
              (this,pBuffVk,Attribs->InstanceBufferTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
               VK_ACCESS_SHADER_READ_BIT,"Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)");
    vkASBuildInfo.ppGeometries = (VkAccelerationStructureGeometryKHR **)0x0;
    vkASBuildInfo.scratchData.deviceAddress = 0;
    vkASBuildInfo.geometryCount = 0;
    vkASBuildInfo._52_4_ = 0;
    vkASBuildInfo.pGeometries = (VkAccelerationStructureGeometryKHR *)0x0;
    vkASBuildInfo.srcAccelerationStructure = (VkAccelerationStructureKHR)0x0;
    vkASBuildInfo.dstAccelerationStructure = (VkAccelerationStructureKHR)0x0;
    vkRangePtr = &local_40;
    local_40.transformOffset = 0;
    vkASBuildInfo.type = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;
    vkASBuildInfo.flags = 0;
    vkASBuildInfo.mode = VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR;
    vkASBuildInfo._28_4_ = 0;
    local_40.primitiveOffset = 0;
    local_40.firstVertex = 0;
    vkASBuildInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    vkASBuildInfo._4_4_ = 0;
    vkASBuildInfo.pNext = (void *)0x0;
    TmpSpace.CPUAddress = (void *)0x0;
    local_40.primitiveCount = Attribs->InstanceCount;
    TmpSpace.vkBuffer = (VkBuffer)0x3b9d13f6;
    TmpSpace.Size = 2;
    TmpSpace.AlignedOffset = 0x3b9d13f4;
    VVar15 = BufferVkImpl::GetVkDeviceAddress(pBuffVk);
    if ((VVar15 + Attribs->InstanceBufferOffset & 0xf) != 0) {
      FormatString<char[46]>(&msg_1,(char (*) [46])"Instance data address is not properly aligned");
      DebugAssertionFailed
                (msg_1._M_dataplus._M_p,"BuildTLAS",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xeb2);
      std::__cxx11::string::~string((string *)&msg_1);
    }
    vkASBuildInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
    vkASBuildInfo._16_8_ = vkASBuildInfo._16_8_ & 0xffffffff00000000;
    VVar14 = BuildASFlagsToVkBuildAccelerationStructureFlags
                       ((TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                        .m_Desc.Flags);
    vkASBuildInfo.flags = VVar14;
    vkASBuildInfo.mode = (uint)Attribs->Update;
    vkASBuildInfo.dstAccelerationStructure = (TLAS->m_VulkanTLAS).m_VkObject;
    vkASBuildInfo.srcAccelerationStructure = (VkAccelerationStructureKHR_T *)0x0;
    if (Attribs->Update != VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR) {
      vkASBuildInfo.srcAccelerationStructure = vkASBuildInfo.dstAccelerationStructure;
    }
    vkASBuildInfo.geometryCount = 1;
    vkASBuildInfo.pGeometries = (VkAccelerationStructureGeometryKHR *)&TmpSpace;
    vkASBuildInfo.ppGeometries = (VkAccelerationStructureGeometryKHR **)0x0;
    VVar15 = BufferVkImpl::GetVkDeviceAddress(Buffer);
    vkASBuildInfo.scratchData.hostAddress = (void *)(VVar15 + Attribs->ScratchBufferOffset);
    if (vkASBuildInfo.scratchData.deviceAddress %
        (ulong)*(uint32_t *)
                ((long)&(((((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.
                           m_pObject)->m_PhysicalDevice)._M_t.
                          super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                          .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>.
                         _M_head_impl)->m_ExtProperties).AccelStruct + 0x38) != 0) {
      FormatString<char[53]>
                (&msg_1,(char (*) [53])"Scratch buffer start address is not properly aligned");
      DebugAssertionFailed
                (msg_1._M_dataplus._M_p,"BuildTLAS",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xec0);
      std::__cxx11::string::~string((string *)&msg_1);
    }
    VulkanUtilities::VulkanCommandBuffer::BuildAccelerationStructure
              (&this->m_CommandBuffer,1,&vkASBuildInfo,&vkRangePtr);
    pUVar1 = &(this->m_State).NumCommands;
    *pUVar1 = *pUVar1 + 1;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::BuildTLAS(const BuildTLASAttribs& Attribs)
{
    TDeviceContextBase::BuildTLAS(Attribs, 0);

    static_assert(TLAS_INSTANCE_DATA_SIZE == sizeof(VkAccelerationStructureInstanceKHR), "Value in TLAS_INSTANCE_DATA_SIZE doesn't match the actual instance description size");

    TopLevelASVkImpl*     pTLASVk      = ClassPtrCast<TopLevelASVkImpl>(Attribs.pTLAS);
    BufferVkImpl*         pScratchVk   = ClassPtrCast<BufferVkImpl>(Attribs.pScratchBuffer);
    BufferVkImpl*         pInstancesVk = ClassPtrCast<BufferVkImpl>(Attribs.pInstanceBuffer);
    const TopLevelASDesc& TLASDesc     = pTLASVk->GetDesc();

    EnsureVkCmdBuffer();

    const char* OpName = "Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)";
    TransitionOrVerifyTLASState(*pTLASVk, Attribs.TLASTransitionMode, RESOURCE_STATE_BUILD_AS_WRITE, OpName);
    TransitionOrVerifyBufferState(*pScratchVk, Attribs.ScratchBufferTransitionMode, RESOURCE_STATE_BUILD_AS_WRITE, VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR, OpName);

    if (Attribs.Update)
    {
        if (!pTLASVk->UpdateInstances(Attribs.pInstances, Attribs.InstanceCount, Attribs.BaseContributionToHitGroupIndex, Attribs.HitGroupStride, Attribs.BindingMode))
            return;
    }
    else
    {
        if (!pTLASVk->SetInstanceData(Attribs.pInstances, Attribs.InstanceCount, Attribs.BaseContributionToHitGroupIndex, Attribs.HitGroupStride, Attribs.BindingMode))
            return;
    }

    // copy instance data into instance buffer
    {
        size_t                 Size     = Attribs.InstanceCount * sizeof(VkAccelerationStructureInstanceKHR);
        VulkanUploadAllocation TmpSpace = m_UploadHeap.Allocate(Size, 16);

        for (Uint32 i = 0; i < Attribs.InstanceCount; ++i)
        {
            const TLASBuildInstanceData& Inst     = Attribs.pInstances[i];
            const TLASInstanceDesc       InstDesc = pTLASVk->GetInstanceDesc(Inst.InstanceName);

            if (InstDesc.InstanceIndex >= Attribs.InstanceCount)
            {
                UNEXPECTED("Failed to find instance by name");
                return;
            }

            VkAccelerationStructureInstanceKHR& vkASInst = static_cast<VkAccelerationStructureInstanceKHR*>(TmpSpace.CPUAddress)[InstDesc.InstanceIndex];
            BottomLevelASVkImpl*                pBLASVk  = ClassPtrCast<BottomLevelASVkImpl>(Inst.pBLAS);

            static_assert(sizeof(vkASInst.transform) == sizeof(Inst.Transform), "size mismatch");
            std::memcpy(&vkASInst.transform, Inst.Transform.data, sizeof(vkASInst.transform));

            vkASInst.instanceCustomIndex                    = Inst.CustomId;
            vkASInst.instanceShaderBindingTableRecordOffset = InstDesc.ContributionToHitGroupIndex;
            vkASInst.mask                                   = Inst.Mask;
            vkASInst.flags                                  = InstanceFlagsToVkGeometryInstanceFlags(Inst.Flags);
            vkASInst.accelerationStructureReference         = pBLASVk->GetVkDeviceAddress();

            TransitionOrVerifyBLASState(*pBLASVk, Attribs.BLASTransitionMode, RESOURCE_STATE_BUILD_AS_READ, OpName);
        }

        UpdateBufferRegion(pInstancesVk, Attribs.InstanceBufferOffset, Size, TmpSpace.vkBuffer, TmpSpace.AlignedOffset, Attribs.InstanceBufferTransitionMode);
    }
    TransitionOrVerifyBufferState(*pInstancesVk, Attribs.InstanceBufferTransitionMode, RESOURCE_STATE_BUILD_AS_READ, VK_ACCESS_SHADER_READ_BIT, OpName);

    VkAccelerationStructureBuildGeometryInfoKHR     vkASBuildInfo = {};
    VkAccelerationStructureBuildRangeInfoKHR        vkRange       = {};
    VkAccelerationStructureBuildRangeInfoKHR const* vkRangePtr    = &vkRange;
    VkAccelerationStructureGeometryKHR              vkASGeometry  = {};

    vkRange.primitiveCount = Attribs.InstanceCount;

    vkASGeometry.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
    vkASGeometry.pNext        = nullptr;
    vkASGeometry.geometryType = VK_GEOMETRY_TYPE_INSTANCES_KHR;
    vkASGeometry.flags        = 0;

    VkAccelerationStructureGeometryInstancesDataKHR& vkASInst{vkASGeometry.geometry.instances};
    vkASInst.sType              = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_INSTANCES_DATA_KHR;
    vkASInst.pNext              = nullptr;
    vkASInst.arrayOfPointers    = VK_FALSE;
    vkASInst.data.deviceAddress = pInstancesVk->GetVkDeviceAddress() + Attribs.InstanceBufferOffset;

    // if geometry.arrayOfPointers is VK_FALSE, geometry.instances.data.deviceAddress must be aligned to 16 bytes
    VERIFY(vkASInst.data.deviceAddress % 16 == 0, "Instance data address is not properly aligned");

    vkASBuildInfo.sType                     = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
    vkASBuildInfo.type                      = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;                    // type must be compatible with create info
    vkASBuildInfo.flags                     = BuildASFlagsToVkBuildAccelerationStructureFlags(TLASDesc.Flags); // flags must be compatible with create info
    vkASBuildInfo.mode                      = Attribs.Update ? VK_BUILD_ACCELERATION_STRUCTURE_MODE_UPDATE_KHR : VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR;
    vkASBuildInfo.srcAccelerationStructure  = Attribs.Update ? pTLASVk->GetVkTLAS() : VK_NULL_HANDLE;
    vkASBuildInfo.dstAccelerationStructure  = pTLASVk->GetVkTLAS();
    vkASBuildInfo.geometryCount             = 1;
    vkASBuildInfo.pGeometries               = &vkASGeometry;
    vkASBuildInfo.ppGeometries              = nullptr;
    vkASBuildInfo.scratchData.deviceAddress = pScratchVk->GetVkDeviceAddress() + Attribs.ScratchBufferOffset;

    const VkPhysicalDeviceAccelerationStructurePropertiesKHR& ASLimits = m_pDevice->GetPhysicalDevice().GetExtProperties().AccelStruct;
    VERIFY(vkASBuildInfo.scratchData.deviceAddress % ASLimits.minAccelerationStructureScratchOffsetAlignment == 0, "Scratch buffer start address is not properly aligned");

    m_CommandBuffer.BuildAccelerationStructure(1, &vkASBuildInfo, &vkRangePtr);
    ++m_State.NumCommands;
}